

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_horiz_rs_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn,int bd)

{
  uint16_t uVar1;
  ulong uVar2;
  long lVar3;
  int x_qn;
  uint uVar4;
  int iVar5;
  uint16_t *puVar6;
  int x;
  ulong uVar7;
  ulong uVar8;
  
  puVar6 = src + -3;
  uVar2 = 0;
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = uVar2;
  }
  if (h < 1) {
    h = 0;
  }
  for (; (int)uVar2 != h; uVar2 = (ulong)((int)uVar2 + 1)) {
    uVar4 = x0_qn;
    for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      iVar5 = 0;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        iVar5 = iVar5 + (int)*(short *)((long)x_filters + lVar3 * 2 + (ulong)(uVar4 >> 4 & 0x3f0)) *
                        (uint)puVar6[((int)uVar4 >> 0xe) + lVar3];
      }
      uVar1 = clip_pixel_highbd(iVar5 + 0x40 >> 7,bd);
      dst[uVar7] = uVar1;
      uVar4 = uVar4 + x_step_qn;
    }
    dst = dst + dst_stride;
    puVar6 = puVar6 + src_stride;
  }
  return;
}

Assistant:

void av1_highbd_convolve_horiz_rs_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const int16_t *x_filters, int x0_qn,
                                    int x_step_qn, int bd) {
  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_qn = x0_qn;
    for (int x = 0; x < w; ++x) {
      const uint16_t *const src_x = &src[x_qn >> RS_SCALE_SUBPEL_BITS];
      const int x_filter_idx =
          (x_qn & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
      assert(x_filter_idx <= RS_SUBPEL_MASK);
      const int16_t *const x_filter =
          &x_filters[x_filter_idx * UPSCALE_NORMATIVE_TAPS];
      int sum = 0;
      for (int k = 0; k < UPSCALE_NORMATIVE_TAPS; ++k)
        sum += src_x[k] * x_filter[k];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      x_qn += x_step_qn;
    }
    src += src_stride;
    dst += dst_stride;
  }
}